

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::
writeImageSamplerDescriptorSetWithTemplate
          (ImageSampleComputeInstance *this,VkDescriptorSet descriptorSet,
          VkDescriptorSetLayout layout,bool withPush,VkPipelineLayout pipelineLayout)

{
  ShaderInputInterface SVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  deUint64 dVar4;
  RefData<vk::Handle<(vk::HandleType)32>_> data;
  undefined8 sampler;
  VkBuffer buffer;
  VkImageView imageView;
  size_t sVar5;
  size_type sVar6;
  Handle<(vk::HandleType)32> *pHVar7;
  deUint8 *pdVar8;
  Move<vk::Handle<(vk::HandleType)32>_> local_200;
  RefData<vk::Handle<(vk::HandleType)32>_> local_1e0;
  VkDescriptorUpdateTemplateEntryKHR local_1c0;
  VkDescriptorUpdateTemplateEntryKHR local_1a0;
  VkDescriptorUpdateTemplateEntryKHR local_180;
  VkDescriptorUpdateTemplateEntryKHR local_160;
  VkDescriptorUpdateTemplateEntryKHR local_140;
  undefined1 local_120 [8];
  VkDescriptorUpdateTemplateCreateInfoKHR templateCreateInfo;
  undefined1 local_b8 [8];
  VkDescriptorImageInfo imageSamplers [2];
  VkSampler samplers [2];
  undefined1 local_60 [8];
  VkDescriptorBufferInfo resultInfo;
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  updateEntries;
  bool withPush_local;
  ImageSampleComputeInstance *this_local;
  VkPipelineLayout pipelineLayout_local;
  VkDescriptorSetLayout layout_local;
  VkDescriptorSet descriptorSet_local;
  
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
            *)&resultInfo.range);
  buffer = ComputeInstanceResultBuffer::getBuffer(&this->m_result);
  ::vk::makeDescriptorBufferInfo((VkDescriptorBufferInfo *)local_60,buffer,0,0x40);
  if (((this->m_isImmutableSampler & 1U) == 0) || (withPush)) {
    imageSamplers[1]._16_8_ = ImageSampleInstanceImages::getSamplerA(&this->m_images);
  }
  else {
    ::vk::Handle<(vk::HandleType)20>::Handle
              ((Handle<(vk::HandleType)20> *)&imageSamplers[1].imageLayout,0);
  }
  if (((this->m_isImmutableSampler & 1U) == 0) || (withPush)) {
    samplers[0] = ImageSampleInstanceImages::getSamplerB(&this->m_images);
  }
  else {
    ::vk::Handle<(vk::HandleType)20>::Handle(samplers,0);
  }
  sampler = imageSamplers[1]._16_8_;
  imageView = ImageSampleInstanceImages::getImageViewA(&this->m_images);
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_b8,(VkSampler)sampler,imageView,
             VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);
  templateCreateInfo._64_8_ = ImageSampleInstanceImages::getImageViewB(&this->m_images);
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)&imageSamplers[0].imageLayout,samplers[0],
             (VkImageView)templateCreateInfo._64_8_,VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);
  local_120._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  templateCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  templateCreateInfo._4_4_ = 0;
  templateCreateInfo.pNext._0_4_ = 0;
  templateCreateInfo.pNext._4_4_ = 0;
  templateCreateInfo.flags = 0;
  templateCreateInfo.descriptorUpdateEntryCount = 0;
  templateCreateInfo.pDescriptorUpdateEntries._0_4_ = withPush & 1;
  templateCreateInfo.descriptorSetLayout.m_internal._0_4_ = 1;
  templateCreateInfo.pipelineLayout.m_internal._0_4_ = 0;
  templateCreateInfo._32_8_ = layout.m_internal;
  templateCreateInfo._48_8_ = pipelineLayout.m_internal;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>
            (&this->m_updateRegistry,(VkDescriptorBufferInfo *)local_60);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>
            (&this->m_updateRegistry,(VkDescriptorImageInfo *)local_b8);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>
            (&this->m_updateRegistry,(VkDescriptorImageInfo *)&imageSamplers[0].imageLayout);
  sVar5 = RawUpdateRegistry::getWriteObjectOffset(&this->m_updateRegistry,0);
  createTemplateBinding(&local_140,0,0,1,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,sVar5,0);
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
               *)&resultInfo.range,&local_140);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    sVar5 = RawUpdateRegistry::getWriteObjectOffset(&this->m_updateRegistry,1);
    createTemplateBinding(&local_160,1,0,1,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,sVar5,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&resultInfo.range,&local_160);
  }
  else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    sVar5 = RawUpdateRegistry::getWriteObjectOffset(&this->m_updateRegistry,1);
    createTemplateBinding(&local_180,1,0,1,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,sVar5,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&resultInfo.range,&local_180);
    sVar5 = RawUpdateRegistry::getWriteObjectOffset(&this->m_updateRegistry,2);
    createTemplateBinding(&local_1a0,2,0,1,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,sVar5,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&resultInfo.range,&local_1a0);
  }
  else if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    sVar5 = RawUpdateRegistry::getWriteObjectOffset(&this->m_updateRegistry,1);
    createTemplateBinding(&local_1c0,1,0,2,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,sVar5,0x18);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&resultInfo.range,&local_1c0);
  }
  templateCreateInfo._16_8_ =
       std::
       vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
       ::operator[]((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                     *)&resultInfo.range,0);
  sVar6 = std::
          vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
          ::size((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                  *)&resultInfo.range);
  templateCreateInfo.pNext._4_4_ = (undefined4)sVar6;
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_200,this->m_vki,this->m_device,
             (VkDescriptorUpdateTemplateCreateInfoKHR *)local_120,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1e0,(Move *)&local_200);
  data.deleter.m_deviceIface = local_1e0.deleter.m_deviceIface;
  data.object.m_internal = local_1e0.object.m_internal;
  data.deleter.m_device = local_1e0.deleter.m_device;
  data.deleter.m_allocator = local_1e0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::operator=(&this->m_updateTemplate,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::~Move(&local_200);
  if (!withPush) {
    pDVar2 = this->m_vki;
    pVVar3 = this->m_device;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::operator*
                       (&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>);
    dVar4 = pHVar7->m_internal;
    pdVar8 = RawUpdateRegistry::getRawPointer(&this->m_updateRegistry);
    (*pDVar2->_vptr_DeviceInterface[0x92])(pDVar2,pVVar3,descriptorSet.m_internal,dVar4,pdVar8);
  }
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::~vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
             *)&resultInfo.range);
  return;
}

Assistant:

void ImageSampleComputeInstance::writeImageSamplerDescriptorSetWithTemplate (vk::VkDescriptorSet descriptorSet, vk::VkDescriptorSetLayout layout, bool withPush, vk::VkPipelineLayout pipelineLayout)
{
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	const vk::VkDescriptorBufferInfo						resultInfo			= vk::makeDescriptorBufferInfo(m_result.getBuffer(), 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkSampler										samplers[2]			=
	{
		(m_isImmutableSampler && !withPush) ? (0) : (m_images.getSamplerA()),
		(m_isImmutableSampler && !withPush) ? (0) : (m_images.getSamplerB()),
	};
	const vk::VkDescriptorImageInfo							imageSamplers[2]	=
	{
		makeDescriptorImageInfo(samplers[0], m_images.getImageViewA(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
		makeDescriptorImageInfo(samplers[1], m_images.getImageViewB(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	};
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// updateCount
		DE_NULL,	// pUpdates
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_COMPUTE,
		pipelineLayout,
		0
	};
	m_updateRegistry.addWriteObject(resultInfo);
	m_updateRegistry.addWriteObject(imageSamplers[0]);
	m_updateRegistry.addWriteObject(imageSamplers[1]);

	// result
	updateEntries.push_back(createTemplateBinding(0, 0, 1, vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, m_updateRegistry.getWriteObjectOffset(0), 0));

	// combined image samplers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(1), 0));
			updateEntries.push_back(createTemplateBinding(2, 0, 1, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(2), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(1, 0, 2, vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, m_updateRegistry.getWriteObjectOffset(1), sizeof(imageSamplers[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries		= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount	= (deUint32)updateEntries.size();

	m_updateTemplate								= vk::createDescriptorUpdateTemplateKHR(m_vki, m_device, &templateCreateInfo);

	if (!withPush)
	{
		m_vki.updateDescriptorSetWithTemplateKHR(m_device, descriptorSet, *m_updateTemplate, m_updateRegistry.getRawPointer());
	}
}